

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::ReadCustomConfigurationFileTree(cmCTest *this,string *dir,cmMakefile *mf)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  _Rb_tree_node_base *p_Var7;
  pointer filename;
  Glob gl;
  char *local_208 [4];
  string fname;
  string rexpr;
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,
                           "* Read custom CTest configuration directory: ");
  poVar5 = std::operator<<(poVar5,(string *)dir);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xc15,(char *)gl.Internals,false);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[19]>
            (&fname,dir,(char (*) [19])"/CTestCustom.cmake");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"* Check for file: ");
  poVar5 = std::operator<<(poVar5,(string *)&fname);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xc18,(char *)gl.Internals,false);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar2 = cmsys::SystemTools::FileExists(&fname);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"* Read custom CTest configuration file: ");
    poVar5 = std::operator<<(poVar5,(string *)&fname);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0xc1c,(char *)gl.Internals,false);
    std::__cxx11::string::~string((string *)&gl);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar3 = cmSystemTools::GetErrorOccurredFlag();
    cmSystemTools::s_FatalErrorOccurred = false;
    cmSystemTools::s_ErrorOccurred = false;
    bVar4 = cmMakefile::ReadListFile(mf,&fname);
    if (bVar4) {
      bVar4 = cmSystemTools::GetErrorOccurredFlag();
      if (bVar4) goto LAB_00210600;
    }
    else {
LAB_00210600:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Problem reading custom configuration: ");
      poVar5 = std::operator<<(poVar5,(string *)&fname);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::stringbuf::str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0xc23,(char *)gl.Internals,false);
      std::__cxx11::string::~string((string *)&gl);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    if (bVar3) {
      cmSystemTools::s_ErrorOccurred = true;
    }
  }
  cmStrCat<std::__cxx11::string_const&,char_const(&)[19]>
            (&rexpr,dir,(char (*) [19])"/CTestCustom.ctest");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"* Check for file: ");
  poVar5 = std::operator<<(poVar5,(string *)&rexpr);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx",
      0xc2c,(char *)gl.Internals,false);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if (!bVar2) {
    bVar2 = cmsys::SystemTools::FileExists(&rexpr);
    if (!bVar2) goto LAB_00210983;
    cmsys::Glob::Glob(&gl);
    gl.Recurse = true;
    cmsys::Glob::FindFiles(&gl,&rexpr,(GlobMessages *)0x0);
    pvVar6 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
    pbVar1 = (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (filename = (pvVar6->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; filename != pbVar1;
        filename = filename + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"* Read custom CTest configuration file: "
                              );
      poVar5 = std::operator<<(poVar5,(string *)filename);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::stringbuf::str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0xc35,local_208[0],false);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      bVar2 = cmMakefile::ReadListFile(mf,filename);
      if (bVar2) {
        bVar2 = cmSystemTools::GetErrorOccurredFlag();
        if (bVar2) goto LAB_00210815;
      }
      else {
LAB_00210815:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Problem reading custom configuration: "
                                );
        poVar5 = std::operator<<(poVar5,(string *)filename);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0xc39,local_208[0],false);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
    }
    cmsys::Glob::~Glob(&gl);
  }
  Private::GetNamedTestingHandlers_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
              *)&gl,(this->Impl)._M_t.
                    super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                    .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl);
  for (p_Var7 = (_Rb_tree_node_base *)gl.Relative._M_string_length;
      p_Var7 != (_Rb_tree_node_base *)&gl.Recurse;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "* Read custom CTest configuration vectors for handler: ");
    poVar5 = std::operator<<(poVar5,(string *)(p_Var7 + 1));
    poVar5 = std::operator<<(poVar5," (");
    poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
    poVar5 = std::operator<<(poVar5,")");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0xc44,local_208[0],false);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    (**(code **)**(undefined8 **)(p_Var7 + 2))(*(undefined8 **)(p_Var7 + 2),mf);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
               *)&gl);
LAB_00210983:
  std::__cxx11::string::~string((string *)&rexpr);
  std::__cxx11::string::~string((string *)&fname);
  return 1;
}

Assistant:

int cmCTest::ReadCustomConfigurationFileTree(const std::string& dir,
                                             cmMakefile* mf)
{
  bool found = false;
  cmCTestLog(this, DEBUG,
             "* Read custom CTest configuration directory: " << dir
                                                             << std::endl);

  std::string fname = cmStrCat(dir, "/CTestCustom.cmake");
  cmCTestLog(this, DEBUG, "* Check for file: " << fname << std::endl);
  if (cmSystemTools::FileExists(fname)) {
    cmCTestLog(this, DEBUG,
               "* Read custom CTest configuration file: " << fname
                                                          << std::endl);
    bool erroroc = cmSystemTools::GetErrorOccurredFlag();
    cmSystemTools::ResetErrorOccurredFlag();

    if (!mf->ReadListFile(fname) || cmSystemTools::GetErrorOccurredFlag()) {
      cmCTestLog(this, ERROR_MESSAGE,
                 "Problem reading custom configuration: " << fname
                                                          << std::endl);
    }
    found = true;
    if (erroroc) {
      cmSystemTools::SetErrorOccurred();
    }
  }

  std::string rexpr = cmStrCat(dir, "/CTestCustom.ctest");
  cmCTestLog(this, DEBUG, "* Check for file: " << rexpr << std::endl);
  if (!found && cmSystemTools::FileExists(rexpr)) {
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.FindFiles(rexpr);
    std::vector<std::string>& files = gl.GetFiles();
    for (const std::string& file : files) {
      cmCTestLog(this, DEBUG,
                 "* Read custom CTest configuration file: " << file
                                                            << std::endl);
      if (!mf->ReadListFile(file) || cmSystemTools::GetErrorOccurredFlag()) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem reading custom configuration: " << file
                                                            << std::endl);
      }
    }
    found = true;
  }

  if (found) {
    for (auto& handler : this->Impl->GetNamedTestingHandlers()) {
      cmCTestLog(this, DEBUG,
                 "* Read custom CTest configuration vectors for handler: "
                   << handler.first << " (" << handler.second << ")"
                   << std::endl);
      handler.second->PopulateCustomVectors(mf);
    }
  }

  return 1;
}